

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01884f40;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01884b98,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01884898;
  pzgeom::TPZNodeRep<8,_pztopology::TPZCube>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>,&PTR_PTR_0187d9c8,nodeindices);
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoCube_0187d970;
  lVar1 = 0x98;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 800);
  lVar1 = 0x98;
  do {
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 800);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}